

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_ild.c
# Opt level: O0

int prefix_evex(pt_ild *ild,uint8_t length,uint8_t rex)

{
  byte x;
  byte bVar1;
  int iVar2;
  uint8_t map;
  uint8_t p2;
  uint8_t p1;
  uint8_t max_bytes;
  uint8_t rex_local;
  uint8_t length_local;
  pt_ild *ild_local;
  
  if (ild == (pt_ild *)0x0) {
    ild_local._4_4_ = -1;
  }
  else {
    bVar1 = ild->max_bytes;
    if (length + 1 < (uint)bVar1) {
      x = get_byte(ild,length + '\x01');
      iVar2 = mode_64b(ild);
      if ((iVar2 == 0) && (iVar2 = bits_match(x,0xc0,0xc0), iVar2 == 0)) {
        iVar2 = opcode_dec(ild,length);
        return iVar2;
      }
      if ((uint)bVar1 < length + 5) {
        ild_local._4_4_ = -0xe;
      }
      else {
        bVar1 = get_byte(ild,length + '\x02');
        ild->vex = '\x02';
        *(ushort *)&ild->field_0x10 =
             *(ushort *)&ild->field_0x10 & 0xfe7f |
             ((ushort)((int)(x ^ 0xffffffff) >> 7) & 1 | (ushort)((int)(x ^ 0xffffffff) >> 3) & 2)
             << 7;
        *(ushort *)&ild->field_0x10 =
             *(ushort *)&ild->field_0x10 & 0xfdff | (short)((int)(uint)bVar1 >> 7) << 9;
        resolve_vex_pp(ild,bVar1 & 3);
        ild->map = x & 7;
        ild_local._4_4_ = prefix_vex_done(ild,length + '\x04');
      }
    }
    else {
      ild_local._4_4_ = -0xe;
    }
  }
  return ild_local._4_4_;
}

Assistant:

static int prefix_evex(struct pt_ild *ild, uint8_t length, uint8_t rex)
{
	uint8_t max_bytes;
	uint8_t p1, p2, map;

	(void) rex;

	if (!ild)
		return -pte_internal;

	max_bytes = ild->max_bytes;

	/* Read the next byte to validate that this is indeed EVEX. */
	if (max_bytes <= (length + 1))
		return -pte_bad_insn;

	p1 = get_byte(ild, length + 1);

	/* If p1[7:6] is not 11b in non-64-bit mode, this is BOUND, not EVEX. */
	if (!mode_64b(ild) && !bits_match(p1, 0xc0, 0xc0))
		return opcode_dec(ild, length);

	/* We need at least 5 bytes
	 * - 4 for the EVEX prefix and payload and
	 * - 1 for the opcode.
	 */
	if (max_bytes < (length + 5))
		return -pte_bad_insn;

	p2 = get_byte(ild, length + 2);

	ild->vex = 2;
	ild->rex_r = ((~p1 >> 7) & 0x01) | ((~p1 >> 3) & 0x02);
	ild->rex_w = (p2 >> 7) & 0x01;

	resolve_vex_pp(ild, p2 & 0x03);

	ild->map = map = p1 & 0x07;

	/* Eat the EVEX. */
	length += 4;
	return prefix_vex_done(ild, length);
}